

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

bool __thiscall
cmQtAutoGenInitializer::GetQtExecutable
          (cmQtAutoGenInitializer *this,GenVarsT *genVars,string *executable,
          bool ignoreMissingTarget)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  size_type sVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  char *pcVar7;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  cmGeneratorTarget *this_01;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string *psVar11;
  CompilerFeatures *__tmp_2;
  _Alloc_hider _Var12;
  string val;
  string prop;
  string local_b8;
  _Base_ptr local_98;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmListFileBacktrace local_88;
  cmListFileBacktrace lfbt;
  cmGeneratorExpression ge;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  pcVar1 = (genVars->GenNameUpper->_M_dataplus)._M_p;
  psVar11 = &prop;
  local_98 = (_Base_ptr)executable;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar11,pcVar1,pcVar1 + genVars->GenNameUpper->_M_string_length);
  std::__cxx11::string::append((char *)psVar11);
  pcVar7 = cmTarget::GetSafeProperty(this->Target->Target,&prop);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&val,pcVar7,(allocator<char> *)&local_b8);
  sVar3 = val._M_string_length;
  if (val._M_string_length != 0) {
    this_00 = cmTarget::GetMakefile(this->Target->Target);
    cmMakefile::GetBacktrace(this_00);
    local_88.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_88.TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = lfbt.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if (lfbt.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (lfbt.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (lfbt.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (lfbt.TopEntry.
              super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    cmGeneratorExpression::cmGeneratorExpression(&ge,&local_88);
    if (local_88.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&cge,(string *)&ge);
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
    local_50._8_8_ = 0;
    local_40._M_local_buf[0] = '\0';
    local_50._M_allocated_capacity = (size_type)&local_40;
    cmCompiledGeneratorExpression::Evaluate
              ((cmCompiledGeneratorExpression *)
               cge._M_t.
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl,pcVar8,
               &local_b8,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0,(string *)&local_50);
    std::__cxx11::string::_M_assign((string *)&genVars->Executable);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_allocated_capacity != &local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,
                      CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr(&cge);
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
    if (lfbt.TopEntry.
        super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (lfbt.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((genVars->Executable)._M_string_length == 0 && !ignoreMissingTarget) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,prop._M_dataplus._M_p,
                 prop._M_dataplus._M_p + prop._M_string_length);
      std::__cxx11::string::append((char *)&local_b8);
      GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                ((anon_class_16_2_c95d1c49 *)this,
                 (string *)(genVars->GenNameUpper->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      psVar11 = (string *)0x0;
    }
    else {
      p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      p_Var9->_M_use_count = 1;
      p_Var9->_M_weak_count = 1;
      p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0069acc0;
      p_Var9[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var9[1]._M_use_count = 0;
      p_Var9[1]._M_weak_count = 0;
      p_Var9[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var9[2]._M_use_count = 0;
      p_Var9[2]._M_weak_count = 0;
      p_Var9[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      *(_Atomic_word **)&p_Var9[1]._M_use_count = &p_Var9[2]._M_use_count;
      p_Var9[3]._M_use_count = 0;
      p_Var9[3]._M_weak_count = 0;
      p_Var9[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var9[4]._M_use_count = 0;
      p_Var9[4]._M_weak_count = 0;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var9 + 1);
      p_Var2 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var9;
      psVar11 = (string *)0x1;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
    }
  }
  paVar10 = &prop.field_2;
  bVar5 = (byte)psVar11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)val._M_dataplus._M_p != &val.field_2) {
    operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prop._M_dataplus._M_p != paVar10) {
    operator_delete(prop._M_dataplus._M_p,
                    CONCAT71(prop.field_2._M_allocated_capacity._1_7_,prop.field_2._M_local_buf[0])
                    + 1);
  }
  if (sVar3 == 0) {
    prop._M_string_length = 0;
    prop.field_2._M_local_buf[0] = '\0';
    uVar6 = (this->QtVersion).Major - 4;
    prop._M_dataplus._M_p = (pointer)paVar10;
    if (uVar6 < 3) {
      std::__cxx11::string::_M_replace
                ((ulong)&prop,0,(char *)0x0,
                 (ulong)(&DAT_00542798 + *(int *)(&DAT_00542798 + (ulong)uVar6 * 4)));
    }
    std::__cxx11::string::_M_append((char *)&prop,*(ulong *)local_98);
    pcVar8 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    this_01 = cmLocalGenerator::FindGeneratorTargetToUse(pcVar8,&prop);
    if (this_01 == (cmGeneratorTarget *)0x0) {
      if (ignoreMissingTarget) {
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
        p_Var9->_M_use_count = 1;
        p_Var9->_M_weak_count = 1;
        p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0069acc0;
        p_Var9[1]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var9[1]._M_use_count = 0;
        p_Var9[1]._M_weak_count = 0;
        p_Var9[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var9[2]._M_use_count = 0;
        p_Var9[2]._M_weak_count = 0;
        p_Var9[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        *(_Atomic_word **)&p_Var9[1]._M_use_count = &p_Var9[2]._M_use_count;
        p_Var9[3]._M_use_count = 0;
        p_Var9[3]._M_weak_count = 0;
        p_Var9[4]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var9[4]._M_use_count = 0;
        p_Var9[4]._M_weak_count = 0;
        (genVars->ExecutableFeatures).
        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var9 + 1);
        p_Var2 = (genVars->ExecutableFeatures).
                 super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (genVars->ExecutableFeatures).
        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = p_Var9;
        bVar5 = 1;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
      else {
        val._M_dataplus._M_p = (pointer)&val.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"Could not find ","");
        std::__cxx11::string::_M_append((char *)&val,*(ulong *)local_98);
        std::__cxx11::string::append((char *)&val);
        std::__cxx11::string::_M_append((char *)&val,(ulong)prop._M_dataplus._M_p);
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)this,
                   (string *)(genVars->GenNameUpper->_M_dataplus)._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)val._M_dataplus._M_p != &val.field_2) {
          operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
        }
        bVar5 = 0;
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&genVars->ExecutableTargetName);
      genVars->ExecutableTarget = this_01;
      bVar4 = cmGeneratorTarget::IsImported(this_01);
      if (bVar4) {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
        cmGeneratorTarget::ImportedGetLocation(&val,this_01,&local_b8);
        std::__cxx11::string::operator=((string *)&genVars->Executable,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)val._M_dataplus._M_p != &val.field_2) {
          operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        val._M_dataplus._M_p = (pointer)&val.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"");
        __s = cmGeneratorTarget::GetLocation(this_01,&val);
        pcVar7 = (char *)(genVars->Executable)._M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&genVars->Executable,0,pcVar7,(ulong)__s);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)val._M_dataplus._M_p != &val.field_2) {
          operator_delete(val._M_dataplus._M_p,val.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prop._M_dataplus._M_p != paVar10) {
      operator_delete(prop._M_dataplus._M_p,
                      CONCAT71(prop.field_2._M_allocated_capacity._1_7_,prop.field_2._M_local_buf[0]
                              ) + 1);
    }
    if (this_01 != (cmGeneratorTarget *)0x0) {
      prop._M_string_length = 0;
      prop.field_2._M_local_buf[0] = '\0';
      prop._M_dataplus._M_p = (pointer)paVar10;
      cmQtAutoGenGlobalInitializer::GetCompilerFeatures
                ((cmQtAutoGenGlobalInitializer *)&val,(string *)this->GlobalInitializer,
                 (string *)local_98,&genVars->Executable);
      sVar3 = val._M_string_length;
      _Var12 = val._M_dataplus;
      val._M_dataplus._M_p = (pointer)0x0;
      val._M_string_length = 0;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var12._M_p;
      p_Var2 = (genVars->ExecutableFeatures).
               super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (genVars->ExecutableFeatures).
      super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        if (val._M_string_length != 0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)val._M_string_length);
        }
        _Var12._M_p = &((genVars->ExecutableFeatures).
                        super___shared_ptr<cmQtAutoGen::CompilerFeatures,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->Evaluated;
      }
      if ((element_type *)_Var12._M_p == (element_type *)0x0) {
        GetQtExecutable::anon_class_16_2_c95d1c49::operator()
                  ((anon_class_16_2_c95d1c49 *)this,
                   (string *)(genVars->GenNameUpper->_M_dataplus)._M_p);
        bVar5 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)prop._M_dataplus._M_p != paVar10) {
        operator_delete(prop._M_dataplus._M_p,
                        CONCAT71(prop.field_2._M_allocated_capacity._1_7_,
                                 prop.field_2._M_local_buf[0]) + 1);
      }
      bVar5 = (element_type *)_Var12._M_p != (element_type *)0x0 | bVar5;
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool cmQtAutoGenInitializer::GetQtExecutable(GenVarsT& genVars,
                                             const std::string& executable,
                                             bool ignoreMissingTarget) const
{
  auto print_err = [this, &genVars](std::string const& err) {
    std::string msg = genVars.GenNameUpper;
    msg += " for target ";
    msg += this->Target->GetName();
    msg += ": ";
    msg += err;
    cmSystemTools::Error(msg);
  };

  // Custom executable
  {
    std::string const prop = genVars.GenNameUpper + "_EXECUTABLE";
    std::string const val = this->Target->Target->GetSafeProperty(prop);
    if (!val.empty()) {
      // Evaluate generator expression
      {
        cmListFileBacktrace lfbt =
          this->Target->Target->GetMakefile()->GetBacktrace();
        cmGeneratorExpression ge(lfbt);
        std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(val);
        genVars.Executable =
          cge->Evaluate(this->Target->GetLocalGenerator(), "");
      }
      if (genVars.Executable.empty() && !ignoreMissingTarget) {
        print_err(prop + " evaluates to an empty value");
        return false;
      }

      // Create empty compiler features.
      genVars.ExecutableFeatures =
        std::make_shared<cmQtAutoGen::CompilerFeatures>();
      return true;
    }
  }

  // Find executable target
  {
    // Find executable target name
    std::string targetName;
    if (this->QtVersion.Major == 4) {
      targetName = "Qt4::";
    } else if (this->QtVersion.Major == 5) {
      targetName = "Qt5::";
    } else if (this->QtVersion.Major == 6) {
      targetName = "Qt6::";
    }
    targetName += executable;

    // Find target
    cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
    cmGeneratorTarget* target = localGen->FindGeneratorTargetToUse(targetName);
    if (target != nullptr) {
      genVars.ExecutableTargetName = targetName;
      genVars.ExecutableTarget = target;
      if (target->IsImported()) {
        genVars.Executable = target->ImportedGetLocation("");
      } else {
        genVars.Executable = target->GetLocation("");
      }
    } else {
      if (ignoreMissingTarget) {
        // Create empty compiler features.
        genVars.ExecutableFeatures =
          std::make_shared<cmQtAutoGen::CompilerFeatures>();
        return true;
      }
      std::string err = "Could not find ";
      err += executable;
      err += " executable target ";
      err += targetName;
      print_err(err);
      return false;
    }
  }

  // Get executable features
  {
    std::string err;
    genVars.ExecutableFeatures = this->GlobalInitializer->GetCompilerFeatures(
      executable, genVars.Executable, err);
    if (!genVars.ExecutableFeatures) {
      print_err(err);
      return false;
    }
  }

  return true;
}